

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::session_handle::
sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **a,
          function<bool_(const_libtorrent::torrent_status_&)> *a_1,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a_2)

{
  int iVar1;
  session_impl *ses;
  io_context *piVar2;
  int iVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 *in_R9;
  bool bVar5;
  bool done;
  exception_ptr ex;
  bool local_a9;
  exception_ptr local_a8;
  void *local_a0;
  undefined1 local_98 [48];
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *local_68;
  _Any_data local_60;
  code *local_50;
  undefined4 local_40;
  io_context *local_38;
  undefined4 local_2c;
  
  this_00 = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar3 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  if ((bVar5) ||
     (ses = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     ses == (session_impl *)0x0)) {
    local_98._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_98);
  }
  local_98._0_8_ = &local_a9;
  local_a9 = false;
  local_98._8_8_ = &local_a8;
  local_a8._M_exception_object = (void *)0x0;
  piVar2 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_68 = *(vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> **)
              &(a_1->super__Function_base)._M_functor;
  local_98._16_8_ = ses;
  local_98._24_8_ = this_00;
  local_98._32_8_ = f;
  local_98._40_8_ = a;
  ::std::function<bool_(const_libtorrent::torrent_status_&)>::function
            ((function<bool_(const_libtorrent::torrent_status_&)> *)&local_60,
             (function<bool_(const_libtorrent::torrent_status_&)> *)a_2);
  local_40 = *in_R9;
  local_2c = 0;
  local_38 = piVar2;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::session_handle::sync_call<void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>(void(libtorrent::aux::session_impl::*)(std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)const,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>*&&,std::function<bool(libtorrent::torrent_status_const&)>const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&)const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_38,(type_conflict *)local_98);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._24_8_);
  }
  aux::torrent_wait(&local_a9,ses);
  if (local_a8._M_exception_object != (void *)0x0) {
    local_a0 = local_a8._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar4 = ::std::rethrow_exception((exception_ptr)&local_a0);
    __clang_call_terminate(uVar4);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void session_handle::sync_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;

		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
	}